

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibraryCase.cpp
# Opt level: O2

bool __thiscall deqp::sl::ShaderCase::execute(ShaderCase *this)

{
  size_type *psVar1;
  bool bVar2;
  ExpectResult EVar3;
  DataType dataType;
  RenderContext *pRVar4;
  pointer pVVar5;
  pointer pVVar6;
  _Alloc_hider __rhs;
  byte bVar7;
  ShaderCase *pSVar8;
  int iVar9;
  deUint32 dVar10;
  int iVar11;
  GLenum GVar12;
  uint numComponents;
  DataType DVar13;
  GLint location;
  uint uVar14;
  int iVar15;
  undefined4 extraout_var;
  int *piVar16;
  ulong uVar17;
  ulong uVar18;
  MessageBuilder *this_00;
  TestError *this_01;
  ulong uVar19;
  long lVar20;
  Surface *surface_00;
  void *__buf;
  char *description;
  Value *val;
  bool bVar21;
  int iVar22;
  int iVar23;
  ulong uVar24;
  ValueBlock *valueBlock;
  vector<float,_std::allocator<float>_> *this_02;
  bool bVar25;
  float fVar26;
  float fVar27;
  allocator<char> local_382;
  allocator<char> local_381;
  TestLog *local_380;
  ShaderCase *local_378;
  int local_36c;
  int local_368;
  int local_364;
  Functions *local_360;
  int local_354;
  int local_350;
  int local_34c;
  int local_348;
  GLint local_344;
  int local_340;
  int local_33c;
  string attribPrefix;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> vertexArrays;
  string attribName;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  attribValues;
  Surface surface;
  Random rnd;
  string errStr;
  ShaderProgram program;
  Functions *gl;
  undefined4 extraout_var_00;
  
  local_380 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar9 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar9);
  iVar9 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  piVar16 = (int *)CONCAT44(extraout_var_00,iVar9);
  dVar10 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar10);
  iVar9 = *piVar16;
  local_36c = 0x80;
  if (iVar9 < 0x80) {
    local_36c = iVar9;
  }
  iVar15 = 0x80;
  if (piVar16[1] < 0x80) {
    iVar15 = piVar16[1];
  }
  iVar9 = de::Random::getInt((Random *)&rnd.m_rnd,0,iVar9 - local_36c);
  iVar11 = de::Random::getInt(&rnd,0,piVar16[1] - iVar15);
  GVar12 = (*gl->getError)();
  glu::checkError(GVar12,"ShaderCase::execute(): start",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                  ,0x117);
  local_368 = iVar15;
  local_340 = iVar11;
  local_33c = iVar9;
  (*gl->viewport)(iVar9,iVar11,local_36c,iVar15);
  pRVar4 = this->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&attribPrefix,(this->m_vertexSource)._M_dataplus._M_p,
             (allocator<char> *)&vertexArrays);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&attribName,(this->m_fragmentSource)._M_dataplus._M_p,
             (allocator<char> *)&attribValues);
  glu::makeVtxFragSources((ProgramSources *)&errStr,&attribPrefix,&attribName);
  glu::ShaderProgram::ShaderProgram(&program,pRVar4,(ProgramSources *)&errStr);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&errStr);
  std::__cxx11::string::~string((string *)&attribName);
  std::__cxx11::string::~string((string *)&attribPrefix);
  bVar25 = ((*program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
              ._M_impl.super__Vector_impl_data._M_start)->m_info).compileOk;
  bVar2 = ((*program.m_shaders[1].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
             _M_impl.super__Vector_impl_data._M_start)->m_info).compileOk;
  glu::operator<<(local_380,&program);
  dVar10 = program.m_program.m_program;
  EVar3 = this->m_expectResult;
  local_378 = this;
  if (EVar3 == EXPECT_PASS) {
    description = "expected shaders to compile and link properly, but failed to compile.";
    if ((bVar25 & bVar2) != 0) {
      description = "expected shaders to compile and link properly, but failed to link.";
    }
    if ((bVar25 & bVar2 & program.m_program.m_info.linkOk) != 0) {
      (*gl->useProgram)(program.m_program.m_program);
      GVar12 = (*gl->getError)();
      glu::checkError(GVar12,"glUseProgram()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                      ,0x15d);
      local_344 = (*gl->getAttribLocation)(dVar10,"dEQP_Position");
      if (local_344 == -1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&errStr,"no location found for attribute \'dEQP_Position\'",
                   (allocator<char> *)&attribPrefix);
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,errStr._M_dataplus._M_p,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                   ,0x164);
        __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      fVar26 = (float)local_368;
      fVar27 = ceilf(fVar26 * 0.0 + 1.0);
      local_348 = (int)fVar27;
      fVar26 = floorf(fVar26 + -0.5);
      local_34c = (int)fVar26;
      fVar26 = (float)local_36c;
      fVar27 = ceilf(fVar26 * 0.0 + 1.0);
      local_350 = (int)fVar27;
      fVar26 = floorf(fVar26 + -0.5);
      local_354 = (int)fVar26;
      local_360 = gl;
      for (lVar20 = 0;
          pVVar5 = (this->m_valueBlocks).
                   super__Vector_base<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          lVar20 < (int)((ulong)((long)(this->m_valueBlocks).
                                       super__Vector_base<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar5) >>
                        5); lVar20 = lVar20 + 1) {
        valueBlock = pVVar5 + lVar20;
        for (iVar9 = 0; iVar9 < valueBlock->arrayLength; iVar9 = iVar9 + 1) {
          uVar17 = ((long)(valueBlock->values).
                          super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(valueBlock->values).
                         super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x48;
          vertexArrays.
          super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          vertexArrays.
          super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          vertexArrays.
          super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          iVar15 = (int)uVar17;
          std::
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ::vector(&attribValues,(long)iVar15,(allocator_type *)&errStr);
          glu::va::Float((VertexArrayBinding *)&errStr,local_344,4,4,0,execute::s_positions);
          std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
          emplace_back<glu::VertexArrayBinding>(&vertexArrays,(VertexArrayBinding *)&errStr);
          std::__cxx11::string::~string((string *)&errStr._M_string_length);
          uVar18 = 0;
          uVar17 = uVar17 & 0xffffffff;
          if (iVar15 < 1) {
            uVar17 = uVar18;
          }
          local_364 = 0;
          for (; uVar18 != uVar17; uVar18 = uVar18 + 1) {
            pVVar6 = (valueBlock->values).
                     super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            __rhs._M_p = pVVar6[uVar18].valueName._M_dataplus._M_p;
            dataType = pVVar6[uVar18].dataType;
            numComponents = glu::getDataTypeScalarSize(dataType);
            GVar12 = (*gl->getError)();
            glu::checkError(GVar12,"before set uniforms",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                            ,0x17f);
            val = pVVar6 + uVar18;
            if (val->storageType == STORAGE_OUTPUT) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&attribPrefix,"ref_",(allocator<char> *)&attribName);
              std::operator+(&errStr,&attribPrefix,__rhs._M_p);
              std::__cxx11::string::~string((string *)&attribPrefix);
              setUniformValue(gl,dVar10,&errStr,val,iVar9);
              GVar12 = (*gl->getError)();
              glu::checkError(GVar12,"set reference uniforms",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                              ,0x1c3);
              std::__cxx11::string::~string((string *)&errStr);
            }
            else if (val->storageType == STORAGE_INPUT) {
              this_02 = attribValues.
                        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + local_364;
              std::vector<float,_std::allocator<float>_>::resize
                        (this_02,(long)(int)(numComponents * 4));
              if ((dataType - TYPE_FLOAT < 4) ||
                 (dataType - TYPE_DOUBLE_MAT2 < 9 || dataType - TYPE_FLOAT_MAT2 < 9)) {
                iVar15 = 0;
                uVar19 = 0;
                if (0 < (int)numComponents) {
                  uVar19 = (ulong)numComponents;
                }
                for (iVar11 = 0; uVar24 = uVar19, iVar22 = iVar9 * numComponents, iVar23 = iVar15,
                    iVar11 != 4; iVar11 = iVar11 + 1) {
                  while (bVar25 = uVar24 != 0, uVar24 = uVar24 - 1, bVar25) {
                    *(Element *)
                     ((this_02->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                      super__Vector_impl_data._M_start + iVar23) =
                         (val->elements).
                         super__Vector_base<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar22];
                    iVar23 = iVar23 + 1;
                    iVar22 = iVar22 + 1;
                  }
                  iVar15 = iVar15 + numComponents;
                }
              }
              else {
                iVar15 = 0;
                uVar19 = 0;
                if (0 < (int)numComponents) {
                  uVar19 = (ulong)numComponents;
                }
                for (iVar11 = 0; uVar24 = uVar19, iVar23 = iVar9 * numComponents, iVar22 = iVar15,
                    iVar11 != 4; iVar11 = iVar11 + 1) {
                  while (uVar24 != 0) {
                    (this_02->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_start[iVar22] =
                         (float)(val->elements).
                                super__Vector_base<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                                ._M_impl.super__Vector_impl_data._M_start[iVar23].int32;
                    uVar24 = uVar24 - 1;
                    iVar23 = iVar23 + 1;
                    iVar22 = iVar22 + 1;
                  }
                  iVar15 = iVar15 + numComponents;
                }
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&attribPrefix,glcts::fixed_sample_locations_values + 1,
                         (allocator<char> *)&errStr);
              if ((local_378->m_caseType == CASETYPE_FRAGMENT_ONLY) ||
                 (DVar13 = glu::getDataTypeScalarType(dataType), DVar13 != TYPE_FLOAT)) {
                std::__cxx11::string::assign((char *)&attribPrefix);
              }
              std::operator+(&attribName,&attribPrefix,__rhs._M_p);
              location = (*local_360->getAttribLocation)(dVar10,attribName._M_dataplus._M_p);
              if (location == -1) {
                errStr._M_dataplus._M_p = (pointer)local_380;
                psVar1 = &errStr._M_string_length;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar1);
                std::operator<<((ostream *)psVar1,"Warning: no location found for attribute \'");
                std::operator<<((ostream *)psVar1,(string *)&attribName);
                std::operator<<((ostream *)psVar1,"\'");
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&errStr,(EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)psVar1);
              }
              else {
                if (dataType - TYPE_FLOAT_MAT2 < 9 || dataType - TYPE_DOUBLE_MAT2 < 9) {
                  uVar14 = glu::getDataTypeMatrixNumColumns(dataType);
                  iVar15 = glu::getDataTypeMatrixNumRows(dataType);
                  iVar11 = 0;
                  uVar19 = (ulong)uVar14;
                  if ((int)uVar14 < 1) {
                    uVar19 = 0;
                  }
                  while (bVar25 = uVar19 != 0, uVar19 = uVar19 - 1, bVar25) {
                    glu::va::Float((VertexArrayBinding *)&errStr,location,iVar15,4,numComponents * 4
                                   ,(this_02->super__Vector_base<float,_std::allocator<float>_>).
                                    _M_impl.super__Vector_impl_data._M_start + iVar11);
                    std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
                    emplace_back<glu::VertexArrayBinding>
                              (&vertexArrays,(VertexArrayBinding *)&errStr);
                    std::__cxx11::string::~string((string *)&errStr._M_string_length);
                    iVar11 = iVar11 + iVar15;
                    location = location + 1;
                  }
                }
                else {
                  glu::va::Float((VertexArrayBinding *)&errStr,location,numComponents,4,0,
                                 (this_02->super__Vector_base<float,_std::allocator<float>_>).
                                 _M_impl.super__Vector_impl_data._M_start);
                  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
                  emplace_back<glu::VertexArrayBinding>(&vertexArrays,(VertexArrayBinding *)&errStr)
                  ;
                  std::__cxx11::string::~string((string *)&errStr._M_string_length);
                }
                GVar12 = (*local_360->getError)();
                glu::checkError(GVar12,"set vertex attrib array",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                                ,0x1bc);
              }
              local_364 = local_364 + 1;
              std::__cxx11::string::~string((string *)&attribName);
              std::__cxx11::string::~string((string *)&attribPrefix);
              gl = local_360;
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&errStr,__rhs._M_p,(allocator<char> *)&attribPrefix);
              setUniformValue(gl,dVar10,&errStr,val,iVar9);
              std::__cxx11::string::~string((string *)&errStr);
              GVar12 = (*gl->getError)();
              glu::checkError(GVar12,"set uniforms",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                              ,0x1c9);
            }
          }
          (*gl->clearColor)(0.0,0.0,0.0,1.0);
          this = local_378;
          (*gl->clear)(0x4000);
          GVar12 = (*gl->getError)();
          glu::checkError(GVar12,"clear buffer",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                          ,0x1d0);
          errStr._M_dataplus._M_p = (pointer)0x600000000;
          errStr._M_string_length._0_4_ = 1;
          errStr.field_2._M_allocated_capacity = (size_type)execute::s_indices;
          glu::draw(this->m_renderCtx,program.m_program.m_program,
                    (int)(((long)vertexArrays.
                                 super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)vertexArrays.
                                super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0x50),
                    vertexArrays.
                    super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                    ._M_impl.super__Vector_impl_data._M_start,(PrimitiveList *)&errStr,
                    (DrawUtilCallback *)0x0);
          GVar12 = (*gl->getError)();
          glu::checkError(GVar12,"draw",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                          ,0x1d5);
          tcu::Surface::Surface(&surface,local_36c,local_368);
          pRVar4 = this->m_renderCtx;
          tcu::Surface::getAccess((PixelBufferAccess *)&errStr,&surface);
          glu::readPixels(pRVar4,local_33c,local_340,(PixelBufferAccess *)&errStr);
          GVar12 = (*gl->getError)();
          glu::checkError(GVar12,"read pixels",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                          ,0x1da);
          bVar25 = checkPixels(this,&surface,local_350,local_354,local_348,local_34c);
          if (!bVar25) {
            psVar1 = &errStr._M_string_length;
            errStr._M_dataplus._M_p = (pointer)local_380;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar1);
            std::operator<<((ostream *)psVar1,"INCORRECT RESULT for (value block ");
            std::ostream::operator<<(psVar1,(int)lVar20 + 1);
            std::operator<<((ostream *)psVar1," of ");
            std::ostream::operator<<
                      (psVar1,(int)((ulong)((long)(local_378->m_valueBlocks).
                                                  super__Vector_base<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)(local_378->m_valueBlocks).
                                                 super__Vector_base<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 5));
            std::operator<<((ostream *)psVar1,", sub-case ");
            std::ostream::operator<<(psVar1,iVar9 + 1);
            std::operator<<((ostream *)psVar1," of ");
            this_00 = tcu::MessageBuilder::operator<<
                                ((MessageBuilder *)&errStr,&valueBlock->arrayLength);
            std::operator<<(&(this_00->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                            "):");
            tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)psVar1);
            psVar1 = &errStr._M_string_length;
            errStr._M_dataplus._M_p = (pointer)local_380;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar1);
            std::operator<<((ostream *)psVar1,"Failing shader input/output values:");
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&errStr,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)psVar1);
            pSVar8 = local_378;
            dumpValues(local_378,valueBlock,iVar9);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&attribPrefix,"Result",&local_381);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&attribName,"Rendered result image",&local_382);
            surface_00 = &surface;
            tcu::LogImage::LogImage
                      ((LogImage *)&errStr,&attribPrefix,&attribName,surface_00,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
            tcu::LogImage::write((LogImage *)&errStr,(int)local_380,__buf,(size_t)surface_00);
            tcu::LogImage::~LogImage((LogImage *)&errStr);
            std::__cxx11::string::~string((string *)&attribName);
            std::__cxx11::string::~string((string *)&attribPrefix);
            (*gl->useProgram)(0);
            tcu::TestContext::setTestResult
                      ((pSVar8->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                       "Image comparison failed");
            tcu::Surface::~Surface(&surface);
            std::
            vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            ::~vector(&attribValues);
            std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::~vector
                      (&vertexArrays);
            goto LAB_00d6d603;
          }
          tcu::Surface::~Surface(&surface);
          std::
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ::~vector(&attribValues);
          std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::~vector
                    (&vertexArrays);
        }
      }
      (*gl->useProgram)(0);
      GVar12 = (*gl->getError)();
      bVar21 = true;
      glu::checkError(GVar12,"ShaderCase::execute(): end",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                      ,0x1f6);
      goto LAB_00d6d605;
    }
LAB_00d6d383:
    psVar1 = &errStr._M_string_length;
    errStr._M_dataplus._M_p = (pointer)local_380;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar1);
    std::operator<<((ostream *)psVar1,"ERROR: ");
    std::operator<<((ostream *)psVar1,description);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&errStr,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)psVar1);
    tcu::TestContext::setTestResult
              ((local_378->super_TestCase).super_TestNode.m_testCtx,
               QP_TEST_RESULT_QUALITY_WARNING -
               ((byte)(~bVar2 | program.m_program.m_info.linkOk |
                      ~bVar25 | local_378->m_expectResult != EXPECT_COMPILE_FAIL) & 1),description);
  }
  else {
    if (EVar3 == EXPECT_COMPILE_FAIL) {
      description = "expected compilation to fail, but both shaders compiled and link failed.";
      if ((program.m_program.m_info.linkOk & 1U) != 0) {
        description = "expected compilation to fail, but both shaders compiled correctly.";
      }
      bVar7 = bVar25 & bVar2;
joined_r0x00d6cbb6:
      bVar21 = true;
      if (bVar7 == 0) goto LAB_00d6d605;
      goto LAB_00d6d383;
    }
    if (EVar3 == EXPECT_LINK_FAIL) {
      description = "expected linking to fail, but unable to compile.";
      if ((bVar25 & bVar2) != 0) {
        description = "expected linking to fail, but passed.";
      }
      bVar7 = (~(bVar25 & bVar2) | program.m_program.m_info.linkOk) & 1;
      goto joined_r0x00d6cbb6;
    }
  }
LAB_00d6d603:
  bVar21 = false;
LAB_00d6d605:
  glu::ShaderProgram::~ShaderProgram(&program);
  return bVar21;
}

Assistant:

bool ShaderCase::execute(void)
{
	TestLog&			  log = m_testCtx.getLog();
	const glw::Functions& gl  = m_renderCtx.getFunctions();

	// Compute viewport.
	const tcu::RenderTarget& renderTarget = m_renderCtx.getRenderTarget();
	de::Random				 rnd(deStringHash(getName()));
	int						 width				= deMin32(renderTarget.getWidth(), VIEWPORT_WIDTH);
	int						 height				= deMin32(renderTarget.getHeight(), VIEWPORT_HEIGHT);
	int						 viewportX			= rnd.getInt(0, renderTarget.getWidth() - width);
	int						 viewportY			= rnd.getInt(0, renderTarget.getHeight() - height);
	const int				 numVerticesPerDraw = 4;

	GLU_EXPECT_NO_ERROR(gl.getError(), "ShaderCase::execute(): start");

	// Setup viewport.
	gl.viewport(viewportX, viewportY, width, height);

	const float		   quadSize			  = 1.0f;
	static const float s_positions[4 * 4] = { -quadSize, -quadSize, 0.0f, 1.0f, -quadSize, +quadSize, 0.0f, 1.0f,
											  +quadSize, -quadSize, 0.0f, 1.0f, +quadSize, +quadSize, 0.0f, 1.0f };

	static const deUint16 s_indices[2 * 3] = { 0, 1, 2, 1, 3, 2 };

	// Setup program.
	glu::ShaderProgram program(m_renderCtx, glu::makeVtxFragSources(m_vertexSource.c_str(), m_fragmentSource.c_str()));

	// Check that compile/link results are what we expect.
	bool		vertexOk   = program.getShaderInfo(SHADERTYPE_VERTEX).compileOk;
	bool		fragmentOk = program.getShaderInfo(SHADERTYPE_FRAGMENT).compileOk;
	bool		linkOk	 = program.getProgramInfo().linkOk;
	const char* failReason = DE_NULL;

	log << program;

	switch (m_expectResult)
	{
	case EXPECT_PASS:
		if (!vertexOk || !fragmentOk)
			failReason = "expected shaders to compile and link properly, but failed to compile.";
		else if (!linkOk)
			failReason = "expected shaders to compile and link properly, but failed to link.";
		break;

	case EXPECT_COMPILE_FAIL:
		if (vertexOk && fragmentOk && !linkOk)
			failReason = "expected compilation to fail, but both shaders compiled and link failed.";
		else if (vertexOk && fragmentOk)
			failReason = "expected compilation to fail, but both shaders compiled correctly.";
		break;

	case EXPECT_LINK_FAIL:
		if (!vertexOk || !fragmentOk)
			failReason = "expected linking to fail, but unable to compile.";
		else if (linkOk)
			failReason = "expected linking to fail, but passed.";
		break;

	default:
		DE_ASSERT(false);
		return false;
	}

	if (failReason != DE_NULL)
	{
		// \todo [2010-06-07 petri] These should be handled in the test case?
		log << TestLog::Message << "ERROR: " << failReason << TestLog::EndMessage;

		// If implementation parses shader at link time, report it as quality warning.
		if (m_expectResult == EXPECT_COMPILE_FAIL && vertexOk && fragmentOk && !linkOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, failReason);
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, failReason);
		return false;
	}

	// Return if compile/link expected to fail.
	if (m_expectResult != EXPECT_PASS)
		return (failReason == DE_NULL);

	// Start using program.
	deUint32 programID = program.getProgram();
	gl.useProgram(programID);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram()");

	// Fetch location for positions positions.
	int positionLoc = gl.getAttribLocation(programID, "dEQP_Position");
	if (positionLoc == -1)
	{
		string errStr = string("no location found for attribute 'dEQP_Position'");
		TCU_FAIL(errStr.c_str());
	}

	// Iterate all value blocks.
	for (int blockNdx = 0; blockNdx < (int)m_valueBlocks.size(); blockNdx++)
	{
		const ValueBlock& valueBlock = m_valueBlocks[blockNdx];

		// Iterate all array sub-cases.
		for (int arrayNdx = 0; arrayNdx < valueBlock.arrayLength; arrayNdx++)
		{
			int						   numValues = (int)valueBlock.values.size();
			vector<VertexArrayBinding> vertexArrays;

			int					   attribValueNdx = 0;
			vector<vector<float> > attribValues(numValues);

			vertexArrays.push_back(va::Float(positionLoc, 4, numVerticesPerDraw, 0, &s_positions[0]));

			// Collect VA pointer for inputs and set uniform values for outputs (refs).
			for (int valNdx = 0; valNdx < numValues; valNdx++)
			{
				const ShaderCase::Value& val		= valueBlock.values[valNdx];
				const char*				 valueName  = val.valueName.c_str();
				DataType				 dataType   = val.dataType;
				int						 scalarSize = getDataTypeScalarSize(val.dataType);

				GLU_EXPECT_NO_ERROR(gl.getError(), "before set uniforms");

				if (val.storageType == ShaderCase::Value::STORAGE_INPUT)
				{
					// Replicate values four times.
					std::vector<float>& scalars = attribValues[attribValueNdx++];
					scalars.resize(numVerticesPerDraw * scalarSize);
					if (isDataTypeFloatOrVec(dataType) || isDataTypeMatrix(dataType))
					{
						for (int repNdx = 0; repNdx < numVerticesPerDraw; repNdx++)
							for (int ndx						   = 0; ndx < scalarSize; ndx++)
								scalars[repNdx * scalarSize + ndx] = val.elements[arrayNdx * scalarSize + ndx].float32;
					}
					else
					{
						// convert to floats.
						for (int repNdx = 0; repNdx < numVerticesPerDraw; repNdx++)
						{
							for (int ndx = 0; ndx < scalarSize; ndx++)
							{
								float v = (float)val.elements[arrayNdx * scalarSize + ndx].int32;
								DE_ASSERT(val.elements[arrayNdx * scalarSize + ndx].int32 == (int)v);
								scalars[repNdx * scalarSize + ndx] = v;
							}
						}
					}

					// Attribute name prefix.
					string attribPrefix = "";
					// \todo [2010-05-27 petri] Should latter condition only apply for vertex cases (or actually non-fragment cases)?
					if ((m_caseType == CASETYPE_FRAGMENT_ONLY) || (getDataTypeScalarType(dataType) != TYPE_FLOAT))
						attribPrefix = "a_";

					// Input always given as attribute.
					string attribName = attribPrefix + valueName;
					int	attribLoc  = gl.getAttribLocation(programID, attribName.c_str());
					if (attribLoc == -1)
					{
						log << TestLog::Message << "Warning: no location found for attribute '" << attribName << "'"
							<< TestLog::EndMessage;
						continue;
					}

					if (isDataTypeMatrix(dataType))
					{
						int numCols = getDataTypeMatrixNumColumns(dataType);
						int numRows = getDataTypeMatrixNumRows(dataType);
						DE_ASSERT(scalarSize == numCols * numRows);

						for (int i = 0; i < numCols; i++)
							vertexArrays.push_back(va::Float(attribLoc + i, numRows, numVerticesPerDraw,
															 static_cast<int>(scalarSize * sizeof(float)),
															 &scalars[i * numRows]));
					}
					else
					{
						DE_ASSERT(isDataTypeFloatOrVec(dataType) || isDataTypeIntOrIVec(dataType) ||
								  isDataTypeUintOrUVec(dataType) || isDataTypeBoolOrBVec(dataType));
						vertexArrays.push_back(va::Float(attribLoc, scalarSize, numVerticesPerDraw, 0, &scalars[0]));
					}

					GLU_EXPECT_NO_ERROR(gl.getError(), "set vertex attrib array");
				}
				else if (val.storageType == ShaderCase::Value::STORAGE_OUTPUT)
				{
					// Set reference value.
					string refName = string("ref_") + valueName;
					setUniformValue(gl, programID, refName, val, arrayNdx);
					GLU_EXPECT_NO_ERROR(gl.getError(), "set reference uniforms");
				}
				else
				{
					DE_ASSERT(val.storageType == ShaderCase::Value::STORAGE_UNIFORM);
					setUniformValue(gl, programID, valueName, val, arrayNdx);
					GLU_EXPECT_NO_ERROR(gl.getError(), "set uniforms");
				}
			}

			// Clear.
			gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
			gl.clear(GL_COLOR_BUFFER_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "clear buffer");

			// Draw.
			draw(m_renderCtx, program.getProgram(), (int)vertexArrays.size(), &vertexArrays[0],
				 pr::Triangles(DE_LENGTH_OF_ARRAY(s_indices), &s_indices[0]));
			GLU_EXPECT_NO_ERROR(gl.getError(), "draw");

			// Read back results.
			Surface surface(width, height);
			glu::readPixels(m_renderCtx, viewportX, viewportY, surface.getAccess());
			GLU_EXPECT_NO_ERROR(gl.getError(), "read pixels");

			float w	= s_positions[3];
			int   minY = deCeilFloatToInt32(((-quadSize / w) * 0.5f + 0.5f) * (float)height + 1.0f);
			int   maxY = deFloorFloatToInt32(((+quadSize / w) * 0.5f + 0.5f) * (float)height - 0.5f);
			int   minX = deCeilFloatToInt32(((-quadSize / w) * 0.5f + 0.5f) * (float)width + 1.0f);
			int   maxX = deFloorFloatToInt32(((+quadSize / w) * 0.5f + 0.5f) * (float)width - 0.5f);

			if (!checkPixels(surface, minX, maxX, minY, maxY))
			{
				log << TestLog::Message << "INCORRECT RESULT for (value block " << (blockNdx + 1) << " of "
					<< (int)m_valueBlocks.size() << ", sub-case " << arrayNdx + 1 << " of " << valueBlock.arrayLength
					<< "):" << TestLog::EndMessage;

				log << TestLog::Message << "Failing shader input/output values:" << TestLog::EndMessage;
				dumpValues(valueBlock, arrayNdx);

				// Dump image on failure.
				log << TestLog::Image("Result", "Rendered result image", surface);

				gl.useProgram(0);
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
				return false;
			}
		}
	}

	gl.useProgram(0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "ShaderCase::execute(): end");
	return true;
}